

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_draw.cpp
# Opt level: O0

bool __thiscall
DCanvas::SetTextureParms(DCanvas *this,DrawParms *parms,FTexture *img,double xx,double yy)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  double dVar7;
  bool ybot;
  bool xright;
  double yy_local;
  double xx_local;
  FTexture *img_local;
  DrawParms *parms_local;
  DCanvas *this_local;
  
  if (img != (FTexture *)0x0) {
    parms->x = xx;
    parms->y = yy;
    dVar7 = FTexture::GetScaledWidthDouble(img);
    parms->texwidth = dVar7;
    dVar7 = FTexture::GetScaledHeightDouble(img);
    parms->texheight = dVar7;
    if (((parms->top == 2147483647.0) && (!NAN(parms->top))) || ((parms->fortext & 1U) != 0)) {
      iVar6 = FTexture::GetScaledTopOffset(img);
      parms->top = (double)iVar6;
    }
    if (((parms->left == 2147483647.0) && (!NAN(parms->left))) || ((parms->fortext & 1U) != 0)) {
      iVar6 = FTexture::GetScaledLeftOffset(img);
      parms->left = (double)iVar6;
    }
    if (((parms->destwidth == 2147483647.0) && (!NAN(parms->destwidth))) ||
       ((parms->fortext & 1U) != 0)) {
      dVar7 = FTexture::GetScaledWidthDouble(img);
      parms->destwidth = dVar7;
    }
    if (((parms->destheight == 2147483647.0) && (!NAN(parms->destheight))) ||
       ((parms->fortext & 1U) != 0)) {
      dVar7 = FTexture::GetScaledHeightDouble(img);
      parms->destheight = dVar7;
    }
    switch(parms->cleanmode) {
    case 0x40001390:
      parms->x = (parms->x - 160.0) * (double)CleanXfac + (double)this->Width * 0.5;
      parms->y = (parms->y - 100.0) * (double)CleanYfac + (double)this->Height * 0.5;
      parms->destwidth = parms->texwidth * (double)CleanXfac;
      parms->destheight = parms->texheight * (double)CleanYfac;
      break;
    default:
      break;
    case 0x40001393:
      parms->destwidth = parms->texwidth * (double)CleanXfac;
      parms->destheight = parms->texheight * (double)CleanYfac;
      break;
    case 0x40001394:
      parms->destwidth = parms->texwidth * (double)CleanXfac_1;
      parms->destheight = parms->texheight * (double)CleanYfac_1;
      break;
    case 0x400013a6:
    case 0x400013a7:
      bVar1 = parms->x != 0.0;
      bVar3 = parms->x <= 0.0;
      bVar2 = parms->y != 0.0;
      bVar4 = parms->y <= 0.0;
      bVar5 = FBoolCVar::operator_cast_to_bool(&hud_scale);
      if (bVar5) {
        parms->x = (double)CleanXfac * parms->x;
        if (parms->cleanmode == 0x400013a7) {
          parms->x = (double)this->Width * 0.5 + parms->x;
        }
        else if (bVar3 && bVar1) {
          parms->x = (double)this->Width + parms->x;
        }
        parms->y = (double)CleanYfac * parms->y;
        if (bVar4 && bVar2) {
          parms->y = (double)this->Height + parms->y;
        }
        parms->destwidth = parms->texwidth * (double)CleanXfac;
        parms->destheight = parms->texheight * (double)CleanYfac;
      }
      else {
        if (parms->cleanmode == 0x400013a7) {
          parms->x = (double)this->Width * 0.5 + parms->x;
        }
        else if (bVar3 && bVar1) {
          parms->x = (double)this->Width + parms->x;
        }
        if (bVar4 && bVar2) {
          parms->y = (double)this->Height + parms->y;
        }
      }
      break;
    case 0x400013ae:
      parms->y = 0.0;
      parms->x = 0.0;
    }
    if (((parms->virtWidth != (double)this->Width) ||
        (NAN(parms->virtWidth) || NAN((double)this->Width))) ||
       ((parms->virtHeight != (double)this->Height ||
        (NAN(parms->virtHeight) || NAN((double)this->Height))))) {
      VirtualToRealCoords(this,&parms->x,&parms->y,&parms->destwidth,&parms->destheight,
                          parms->virtWidth,parms->virtHeight,(bool)(parms->virtBottom & 1),
                          (bool)((parms->keepratio != 0 ^ 0xffU) & 1));
    }
  }
  return false;
}

Assistant:

bool DCanvas::SetTextureParms(DrawParms *parms, FTexture *img, double xx, double yy) const
{
	if (img != NULL)
	{
		parms->x = xx;
		parms->y = yy;
		parms->texwidth = img->GetScaledWidthDouble();
		parms->texheight = img->GetScaledHeightDouble();
		if (parms->top == INT_MAX || parms->fortext)
		{
			parms->top = img->GetScaledTopOffset();
		}
		if (parms->left == INT_MAX || parms->fortext)
		{
			parms->left = img->GetScaledLeftOffset();
		}
		if (parms->destwidth == INT_MAX || parms->fortext)
		{
			parms->destwidth = img->GetScaledWidthDouble();
		}
		if (parms->destheight == INT_MAX || parms->fortext)
		{
			parms->destheight = img->GetScaledHeightDouble();
		}

		switch (parms->cleanmode)
		{
		default:
			break;

		case DTA_Clean:
			parms->x = (parms->x - 160.0) * CleanXfac + (Width * 0.5);
			parms->y = (parms->y - 100.0) * CleanYfac + (Height * 0.5);
			parms->destwidth = parms->texwidth * CleanXfac;
			parms->destheight = parms->texheight * CleanYfac;
			break;

		case DTA_CleanNoMove:
			parms->destwidth = parms->texwidth * CleanXfac;
			parms->destheight = parms->texheight * CleanYfac;
			break;

		case DTA_CleanNoMove_1:
			parms->destwidth = parms->texwidth * CleanXfac_1;
			parms->destheight = parms->texheight * CleanYfac_1;
			break;

		case DTA_Fullscreen:
			parms->x = parms->y = 0;
			break;

		case DTA_HUDRules:
		case DTA_HUDRulesC:
		{
			bool xright = parms->x < 0;
			bool ybot = parms->y < 0;

			if (hud_scale)
			{
				parms->x *= CleanXfac;
				if (parms->cleanmode == DTA_HUDRulesC)
					parms->x += Width * 0.5;
				else if (xright)
					parms->x = Width + parms->x;
				parms->y *= CleanYfac;
				if (ybot)
					parms->y = Height + parms->y;
				parms->destwidth = parms->texwidth * CleanXfac;
				parms->destheight = parms->texheight * CleanYfac;
			}
			else
			{
				if (parms->cleanmode == DTA_HUDRulesC)
					parms->x += Width * 0.5;
				else if (xright)
					parms->x = Width + parms->x;
				if (ybot)
					parms->y = Height + parms->y;
			}
			break;
		}
		}
		if (parms->virtWidth != Width || parms->virtHeight != Height)
		{
			VirtualToRealCoords(parms->x, parms->y, parms->destwidth, parms->destheight,
				parms->virtWidth, parms->virtHeight, parms->virtBottom, !parms->keepratio);
		}
	}

	return false;
}